

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void worker(void *arg)

{
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  bool bVar6;
  long *plStack_20;
  int is_slow_work;
  QUEUE *q;
  uv__work *w;
  void *arg_local;
  
  uv_sem_post((uv_sem_t *)arg);
  uv_mutex_lock(&mutex);
LAB_007f49fb:
  do {
    while( true ) {
      while( true ) {
        uVar3 = slow_io_work_running;
        bVar6 = true;
        if ((((void **)wq[0] != wq) && (bVar6 = false, (void **)wq[0] == run_slow_work_message)) &&
           (bVar6 = false, (void **)run_slow_work_message[0] == wq)) {
          uVar4 = slow_work_thread_threshold();
          bVar6 = uVar4 <= uVar3;
        }
        pvVar2 = wq[0];
        if (!bVar6) break;
        idle_threads = idle_threads + 1;
        uv_cond_wait(&cond,&mutex);
        idle_threads = idle_threads - 1;
      }
      plStack_20 = (long *)wq[0];
      if ((void **)wq[0] == exit_message) {
        uv_cond_signal(&cond);
        uv_mutex_unlock(&mutex);
        return;
      }
      **(undefined8 **)((long)wq[0] + 8) = *wq[0];
      *(undefined8 *)(*pvVar2 + 8) = *(undefined8 *)((long)pvVar2 + 8);
      *(void **)pvVar2 = pvVar2;
      *(void **)((long)pvVar2 + 8) = pvVar2;
      uVar3 = slow_io_work_running;
      bVar6 = false;
      if ((void **)pvVar2 == run_slow_work_message) break;
LAB_007f4c56:
      uv_mutex_unlock(&mutex);
      plVar5 = plStack_20 + -3;
      (*(code *)*plVar5)(plVar5);
      uv_mutex_lock((uv_mutex_t *)(plStack_20[-1] + 0x88));
      *plVar5 = 0;
      *plStack_20 = plStack_20[-1] + 0x78;
      plStack_20[1] = *(long *)(plStack_20[-1] + 0x80);
      *(long **)plStack_20[1] = plStack_20;
      *(long **)(plStack_20[-1] + 0x80) = plStack_20;
      uv_async_send((uv_async_t *)(plStack_20[-1] + 0xb0));
      uv_mutex_unlock((uv_mutex_t *)(plStack_20[-1] + 0x88));
      uv_mutex_lock(&mutex);
      if (bVar6) {
        slow_io_work_running = slow_io_work_running - 1;
      }
    }
    uVar4 = slow_work_thread_threshold();
    pvVar1 = slow_io_pending_wq[0];
    if (uVar3 < uVar4) {
      if ((void **)slow_io_pending_wq[0] != slow_io_pending_wq) {
        bVar6 = true;
        slow_io_work_running = slow_io_work_running + 1;
        plStack_20 = (long *)slow_io_pending_wq[0];
        **(undefined8 **)((long)slow_io_pending_wq[0] + 8) = *slow_io_pending_wq[0];
        *(undefined8 *)(*pvVar1 + 8) = *(undefined8 *)((long)pvVar1 + 8);
        *(void **)pvVar1 = pvVar1;
        *(void **)((long)pvVar1 + 8) = pvVar1;
        if ((void **)slow_io_pending_wq[0] != slow_io_pending_wq) {
          run_slow_work_message[0] = wq;
          run_slow_work_message[1] = wq[1];
          *(void ***)wq[1] = run_slow_work_message;
          wq[1] = run_slow_work_message;
          if (idle_threads != 0) {
            uv_cond_signal(&cond);
          }
        }
        goto LAB_007f4c56;
      }
      goto LAB_007f49fb;
    }
    run_slow_work_message[0] = wq;
    run_slow_work_message[1] = wq[1];
    *(void ***)wq[1] = run_slow_work_message;
    wq[1] = pvVar2;
  } while( true );
}

Assistant:

static void worker(void* arg) {
  struct uv__work* w;
  QUEUE* q;
  int is_slow_work;

  uv_sem_post((uv_sem_t*) arg);
  arg = NULL;

  uv_mutex_lock(&mutex);
  for (;;) {
    /* `mutex` should always be locked at this point. */

    /* Keep waiting while either no work is present or only slow I/O
       and we're at the threshold for that. */
    while (QUEUE_EMPTY(&wq) ||
           (QUEUE_HEAD(&wq) == &run_slow_work_message &&
            QUEUE_NEXT(&run_slow_work_message) == &wq &&
            slow_io_work_running >= slow_work_thread_threshold())) {
      idle_threads += 1;
      uv_cond_wait(&cond, &mutex);
      idle_threads -= 1;
    }

    q = QUEUE_HEAD(&wq);
    if (q == &exit_message) {
      uv_cond_signal(&cond);
      uv_mutex_unlock(&mutex);
      break;
    }

    QUEUE_REMOVE(q);
    QUEUE_INIT(q);  /* Signal uv_cancel() that the work req is executing. */

    is_slow_work = 0;
    if (q == &run_slow_work_message) {
      /* If we're at the slow I/O threshold, re-schedule until after all
         other work in the queue is done. */
      if (slow_io_work_running >= slow_work_thread_threshold()) {
        QUEUE_INSERT_TAIL(&wq, q);
        continue;
      }

      /* If we encountered a request to run slow I/O work but there is none
         to run, that means it's cancelled => Start over. */
      if (QUEUE_EMPTY(&slow_io_pending_wq))
        continue;

      is_slow_work = 1;
      slow_io_work_running++;

      q = QUEUE_HEAD(&slow_io_pending_wq);
      QUEUE_REMOVE(q);
      QUEUE_INIT(q);

      /* If there is more slow I/O work, schedule it to be run as well. */
      if (!QUEUE_EMPTY(&slow_io_pending_wq)) {
        QUEUE_INSERT_TAIL(&wq, &run_slow_work_message);
        if (idle_threads > 0)
          uv_cond_signal(&cond);
      }
    }

    uv_mutex_unlock(&mutex);

    w = QUEUE_DATA(q, struct uv__work, wq);
    w->work(w);

    uv_mutex_lock(&w->loop->wq_mutex);
    w->work = NULL;  /* Signal uv_cancel() that the work req is done
                        executing. */
    QUEUE_INSERT_TAIL(&w->loop->wq, &w->wq);
    uv_async_send(&w->loop->wq_async);
    uv_mutex_unlock(&w->loop->wq_mutex);

    /* Lock `mutex` since that is expected at the start of the next
     * iteration. */
    uv_mutex_lock(&mutex);
    if (is_slow_work) {
      /* `slow_io_work_running` is protected by `mutex`. */
      slow_io_work_running--;
    }
  }
}